

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O3

int __thiscall
leveldb::InternalKeyComparator::Compare(InternalKeyComparator *this,Slice *akey,Slice *bkey)

{
  uint uVar1;
  long in_FS_OFFSET;
  char *local_28;
  long local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (7 < akey->size_) {
    local_28 = akey->data_;
    local_20 = akey->size_ - 8;
    if (7 < bkey->size_) {
      uVar1 = (*this->user_comparator_->_vptr_Comparator[2])(this->user_comparator_,&local_28);
      if (uVar1 == 0) {
        uVar1 = 0xffffffff;
        if (*(ulong *)(akey->data_ + (akey->size_ - 8)) <=
            *(ulong *)(bkey->data_ + (bkey->size_ - 8))) {
          uVar1 = (uint)(*(ulong *)(akey->data_ + (akey->size_ - 8)) <
                        *(ulong *)(bkey->data_ + (bkey->size_ - 8)));
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        return uVar1;
      }
      __stack_chk_fail();
    }
  }
  __assert_fail("internal_key.size() >= 8",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.h"
                ,0x60,"Slice leveldb::ExtractUserKey(const Slice &)");
}

Assistant:

int InternalKeyComparator::Compare(const Slice& akey, const Slice& bkey) const {
  // Order by:
  //    increasing user key (according to user-supplied comparator)
  //    decreasing sequence number
  //    decreasing type (though sequence# should be enough to disambiguate)
  int r = user_comparator_->Compare(ExtractUserKey(akey), ExtractUserKey(bkey));
  if (r == 0) {
    const uint64_t anum = DecodeFixed64(akey.data() + akey.size() - 8);
    const uint64_t bnum = DecodeFixed64(bkey.data() + bkey.size() - 8);
    if (anum > bnum) {
      r = -1;
    } else if (anum < bnum) {
      r = +1;
    }
  }
  return r;
}